

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

void rc::detail::checkGTest<void(*)()>(_func_void **testable)

{
  UnitTest *this;
  TestInfo *pTVar1;
  SuccessResult *pSVar2;
  TestMetadata *args;
  allocator<char> local_2d9;
  AssertHelper local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  TestMetadata metadata;
  TestResult result;
  ostringstream ss;
  _Rb_tree<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>,_std::_Select1st<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>_>,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>_>_>
  local_188 [7];
  
  this = testing::UnitTest::GetInstance();
  pTVar1 = testing::UnitTest::current_test_info(this);
  metadata.id._M_dataplus._M_p = (pointer)&metadata.id.field_2;
  metadata.id._M_string_length = 0;
  metadata.id.field_2._M_local_buf[0] = '\0';
  args = (TestMetadata *)&metadata.description.field_2;
  metadata.description._M_string_length = 0;
  metadata.description.field_2._M_local_buf[0] = '\0';
  metadata.description._M_dataplus._M_p = (pointer)args;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,(pTVar1->test_suite_name_)._M_dataplus._M_p,
             (allocator<char> *)&local_2d8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 &local_2b0,"/");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,(pTVar1->name_)._M_dataplus._M_p,&local_2d9);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 &local_2d0);
  std::__cxx11::string::operator=((string *)&metadata,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,(pTVar1->name_)._M_dataplus._M_p,(allocator<char> *)&result);
  std::__cxx11::string::operator=((string *)&metadata.description,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  checkTestable<void(*)(),rc::detail::TestMetadata&>
            (&result,(detail *)testable,(_func_void **)&metadata,args);
  if (result.m_typeIndex == 0) {
    pSVar2 = Variant<rc::detail::SuccessResult,_rc::detail::FailureResult,_rc::detail::GaveUpResult,_rc::detail::Error>
             ::get<rc::detail::SuccessResult>(&result);
    SuccessResult::SuccessResult((SuccessResult *)&ss,pSVar2);
    if (local_188[0]._M_impl.super__Rb_tree_header._M_node_count != 0) {
      printResultMessage(&result,(ostream *)&std::cout);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    std::
    _Rb_tree<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>,_std::_Select1st<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>_>,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>_>_>
    ::~_Rb_tree(local_188);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    printResultMessage(&result,(ostream *)&ss);
    testing::Message::Message((Message *)&local_2d0);
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)(local_2d0._M_dataplus._M_p + 0x10),(string *)&local_2b0);
    std::endl<char,std::char_traits<char>>((ostream *)(local_2d0._M_dataplus._M_p + 0x10));
    testing::internal::AssertHelper::AssertHelper
              (&local_2d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/rapidcheck/extras/gtest/include/rapidcheck/gtest.h"
               ,0x1d,"Failed");
    testing::internal::AssertHelper::operator=(&local_2d8,(Message *)&local_2d0);
    testing::internal::AssertHelper::~AssertHelper(&local_2d8);
    std::__cxx11::string::~string((string *)&local_2b0);
    if ((long *)local_2d0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2d0._M_dataplus._M_p + 8))();
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  }
  Variant<rc::detail::SuccessResult,_rc::detail::FailureResult,_rc::detail::GaveUpResult,_rc::detail::Error>
  ::~Variant(&result);
  TestMetadata::~TestMetadata(&metadata);
  return;
}

Assistant:

void checkGTest(Testable &&testable) {
  const auto testInfo = ::testing::UnitTest::GetInstance()->current_test_info();
  TestMetadata metadata;
  metadata.id = std::string(testInfo->test_case_name()) + "/" +
      std::string(testInfo->name());
  metadata.description = std::string(testInfo->name());

  const auto result = checkTestable(std::forward<Testable>(testable), metadata);

  if (result.template is<SuccessResult>()) {
    const auto success = result.template get<SuccessResult>();
    if (!success.distribution.empty()) {
      printResultMessage(result, std::cout);
      std::cout << std::endl;
    }
  } else {
    std::ostringstream ss;
    printResultMessage(result, ss);
    FAIL() << ss.str() << std::endl;
  }
}